

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QByteArray * __thiscall
QMap<QSettingsKey,_QByteArray>::operator[](QMap<QSettingsKey,_QByteArray> *this,QSettingsKey *key)

{
  QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QSettingsKey,_QByteArray>_>,_bool> pVar3;
  QMap<QSettingsKey,_QByteArray> copy;
  pair<const_QSettingsKey,_QByteArray> local_58;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>_*>
          )(QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>
            *)0x0;
  }
  else {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_28.d.ptr !=
        (QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>
         *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>
                          *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QSettingsKey,_std::pair<const_QSettingsKey,_QByteArray>,_std::_Select1st<std::pair<const_QSettingsKey,_QByteArray>_>,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_58.first.super_QString.d.d = (key->super_QString).d.d;
    local_58.first.super_QString.d.ptr = (key->super_QString).d.ptr;
    local_58.first.super_QString.d.size = (key->super_QString).d.size;
    if (&(local_58.first.super_QString.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.first.super_QString.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.first.super_QString.d.d)->super_QArrayData).ref_)->ref_).
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.second.d.d = (Data *)0x0;
    local_58.second.d.ptr = (char *)0x0;
    local_58.second.d.size = 0;
    pVar3 = std::
            _Rb_tree<QSettingsKey,std::pair<QSettingsKey_const,QByteArray>,std::_Select1st<std::pair<QSettingsKey_const,QByteArray>>,std::less<QSettingsKey>,std::allocator<std::pair<QSettingsKey_const,QByteArray>>>
            ::_M_insert_unique<std::pair<QSettingsKey_const,QByteArray>>
                      ((_Rb_tree<QSettingsKey,std::pair<QSettingsKey_const,QByteArray>,std::_Select1st<std::pair<QSettingsKey_const,QByteArray>>,std::less<QSettingsKey>,std::allocator<std::pair<QSettingsKey_const,QByteArray>>>
                        *)&pQVar1->m,&local_58);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    if (&(local_58.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_58.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_58.second.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_58.first.super_QString.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.first.super_QString.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
      _M_i = ((local_58.first.super_QString.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.first.super_QString.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.first.super_QString.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QByteArray *)&iVar2._M_node[1]._M_right;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }